

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O2

VarStatus __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::basisStatusToVarStatus
          (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,Status stat)

{
  uint uVar1;
  ostream *poVar2;
  SPxInternalCodeException *this_00;
  allocator local_39;
  string local_38;
  
  uVar1 = stat + D_ON_BOTH;
  if ((uVar1 < 0xf) && ((0x55b5U >> (uVar1 & 0x1f) & 1) != 0)) {
    return *(VarStatus *)(&DAT_00489bcc + (ulong)uVar1 * 4);
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"ESOLVE26 ERROR: unknown basis status (");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,stat);
  poVar2 = std::operator<<(poVar2,")");
  std::endl<char,std::char_traits<char>>(poVar2);
  this_00 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&local_38,"XSOLVE22 This should never happen.",&local_39);
  SPxInternalCodeException::SPxInternalCodeException(this_00,&local_38);
  __cxa_throw(this_00,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
}

Assistant:

typename SPxSolverBase<R>::VarStatus
   SPxSolverBase<R>::basisStatusToVarStatus(typename SPxBasisBase<R>::Desc::Status stat) const
   {
      VarStatus vstat;

      switch(stat)
      {
      case SPxBasisBase<R>::Desc::P_ON_LOWER:
         vstat = ON_LOWER;
         break;

      case SPxBasisBase<R>::Desc::P_ON_UPPER:
         vstat = ON_UPPER;
         break;

      case SPxBasisBase<R>::Desc::P_FIXED:
         vstat = FIXED;
         break;

      case SPxBasisBase<R>::Desc::P_FREE:
         vstat = ZERO;
         break;

      case SPxBasisBase<R>::Desc::D_ON_UPPER:
      case SPxBasisBase<R>::Desc::D_ON_LOWER:
      case SPxBasisBase<R>::Desc::D_ON_BOTH:
      case SPxBasisBase<R>::Desc::D_UNDEFINED:
      case SPxBasisBase<R>::Desc::D_FREE:
         vstat = BASIC;
         break;

      default:
         SPX_MSG_ERROR(std::cerr << "ESOLVE26 ERROR: unknown basis status (" << static_cast<int>(stat) << ")"
                       << std::endl;)
         throw SPxInternalCodeException("XSOLVE22 This should never happen.");
      }

      return vstat;
   }